

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O1

Vec_Ptr_t * Bac_PtrTransformSigs(Vec_Ptr_t *vSig)

{
  uint uVar1;
  int iVar2;
  char *__s;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  size_t sVar5;
  char *__dest;
  uint uVar6;
  long lVar7;
  
  iVar2 = vSig->nSize;
  if ((long)iVar2 < 0) {
    __assert_fail("nCap >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,99,"Vec_Ptr_t *Vec_PtrAllocExact(int)");
  }
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar2;
  if (iVar2 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar2 << 3);
  }
  pVVar3->pArray = ppvVar4;
  if (0 < vSig->nSize) {
    uVar6 = pVVar3->nCap;
    iVar2 = pVVar3->nSize;
    ppvVar4 = pVVar3->pArray;
    lVar7 = 0;
    do {
      __s = (char *)vSig->pArray[lVar7];
      if (__s == (char *)0x0) {
        __dest = (char *)0x0;
      }
      else {
        sVar5 = strlen(__s);
        __dest = (char *)malloc(sVar5 + 1);
        strcpy(__dest,__s);
      }
      if (iVar2 + (int)lVar7 == uVar6) {
        if ((int)uVar6 < 0x10) {
          if (ppvVar4 == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(ppvVar4,0x80);
          }
          uVar6 = 0x10;
        }
        else {
          uVar1 = uVar6 * 2;
          if (SBORROW4(uVar6,uVar1) != 0 < (int)uVar6) {
            uVar6 = uVar1;
            if (ppvVar4 == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar1 << 3);
            }
            else {
              ppvVar4 = (void **)realloc(ppvVar4,(ulong)uVar1 << 3);
            }
          }
        }
      }
      ppvVar4[iVar2 + lVar7] = __dest;
      lVar7 = lVar7 + 1;
    } while (lVar7 < vSig->nSize);
    pVVar3->nSize = iVar2 + (int)lVar7;
    pVVar3->nCap = uVar6;
    pVVar3->pArray = ppvVar4;
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Bac_PtrTransformSigs( Vec_Ptr_t * vSig )
{
    char * pName; int i;
    Vec_Ptr_t * vNew = Vec_PtrAllocExact( Vec_PtrSize(vSig) );
    Vec_PtrForEachEntry( char *, vSig, pName, i )
        Vec_PtrPush( vNew, Abc_UtilStrsav(pName) );
    return vNew;
}